

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_safe_cond_swap(mbedtls_mpi *X,mbedtls_mpi *Y,uchar swap)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = 0;
  if (X != Y) {
    uVar4 = -(ulong)swap;
    iVar3 = mbedtls_mpi_grow(X,(ulong)Y->n);
    if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_grow(Y,(ulong)X->n), iVar3 == 0)) {
      uVar1 = X->s;
      uVar2 = (ushort)((long)uVar4 >> 0x3f);
      X->s = uVar1 & ~uVar2 | Y->s & uVar2;
      Y->s = Y->s & ~uVar2 | uVar1 & uVar2;
      mbedtls_mpi_core_cond_swap(X->p,Y->p,(ulong)X->n,(long)(uVar4 | swap) >> 0x3f);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_safe_cond_swap(mbedtls_mpi *X,
                               mbedtls_mpi *Y,
                               unsigned char swap)
{
    int ret = 0;
    int s;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(Y != NULL);

    if (X == Y) {
        return 0;
    }

    mbedtls_ct_condition_t do_swap = mbedtls_ct_bool(swap);

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, Y->n));
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(Y, X->n));

    s = X->s;
    X->s = (int) mbedtls_ct_uint_if(do_swap, Y->s, X->s);
    Y->s = (int) mbedtls_ct_uint_if(do_swap, s, Y->s);

    mbedtls_mpi_core_cond_swap(X->p, Y->p, X->n, do_swap);

cleanup:
    return ret;
}